

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msat.hpp
# Opt level: O3

void __thiscall CompoundFile::MSAT::loadMSAT(MSAT *this)

{
  istream *piVar1;
  pointer pSVar2;
  pointer pSVar3;
  iterator __position;
  int32_t secID_1;
  uint uVar4;
  int32_t i;
  int iVar5;
  long lVar6;
  int32_t secID;
  uint uVar7;
  char c;
  char c_1;
  SecID local_6c;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> local_68;
  MSAT *local_50;
  uint local_44;
  ulong local_40;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *local_38;
  
  piVar1 = this->m_stream;
  local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = 0;
  local_50 = this;
  do {
    lVar6 = 0;
    uVar7 = 0;
    do {
      local_6c.m_id = local_6c.m_id & 0xffffff00;
      std::istream::get((char *)piVar1);
      uVar7 = uVar7 | (local_6c.m_id & 0xffU) << ((byte)lVar6 & 0x1f);
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x20);
    if (uVar7 != 0xffffffff) {
      local_6c.m_id = uVar7;
      if (local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::
        _M_realloc_insert<CompoundFile::SecID>
                  (&local_68,
                   (iterator)
                   local_68.
                   super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_6c);
      }
      else {
        (local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
         _M_impl.super__Vector_impl_data._M_finish)->m_id = uVar7;
        local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x6d);
  pSVar2 = (this->m_msat).
           super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar3 = (this->m_msat).
           super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->m_msat).super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_msat).super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->m_msat).super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pSVar2 != (pointer)0x0) {
    operator_delete(pSVar2,(long)pSVar3 - (long)pSVar2);
    if (local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_44 = this->m_header->m_sectorsInMSAT;
  if (0 < (int)local_44) {
    local_38 = &this->m_msat;
    uVar7 = (this->m_header->m_msatFirstSecID).m_id;
    local_40 = 0;
    do {
      std::istream::seekg(this->m_stream,
                          (long)(int)uVar7 * (long)this->m_header->m_sectorSize + 0x200,0);
      piVar1 = this->m_stream;
      iVar5 = this->m_header->m_sectorSize;
      if (7 < iVar5) {
        uVar7 = 0;
        do {
          lVar6 = 0;
          uVar4 = 0;
          do {
            local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_68.
                                  super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                                  ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
            std::istream::get((char *)piVar1);
            uVar4 = uVar4 | (uint)(byte)local_68.
                                        super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                                        ._M_impl.super__Vector_impl_data._M_start <<
                            ((byte)lVar6 & 0x1f);
            lVar6 = lVar6 + 8;
          } while (lVar6 != 0x20);
          local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_68.
                                 super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar4);
          __position._M_current =
               (local_50->m_msat).
               super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
               .super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (local_50->m_msat).
              super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::
            _M_realloc_insert<CompoundFile::SecID>(local_38,__position,(SecID *)&local_68);
          }
          else {
            (__position._M_current)->m_id = uVar4;
            (local_50->m_msat).
            super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != iVar5 - 4U >> 2);
      }
      lVar6 = 0;
      uVar7 = 0;
      do {
        local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)local_68.
                              super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        std::istream::get((char *)piVar1);
        uVar7 = uVar7 | (uint)(byte)local_68.
                                    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                                    ._M_impl.super__Vector_impl_data._M_start <<
                        ((byte)lVar6 & 0x1f);
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x20);
      uVar4 = (int)local_40 + 1;
      local_40 = (ulong)uVar4;
      this = local_50;
    } while (uVar4 != local_44);
  }
  return;
}

Assistant:

inline void
MSAT::loadMSAT()
{
	m_msat = loadFirst109SecIDs( m_stream );

	const int32_t msatSectorsCount = m_header.sectorsInMSAT();

	SecID id = m_header.msatFirstSecID();

	for( int32_t i = 0; i < msatSectorsCount; ++i )
	{
		m_stream.seekg( calcFileOffset( id, m_header.sectorSize() ) );

		loadMSATSector( m_stream, m_msat, id, m_header.sectorSize() );
	}
}